

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall CClient::SwitchWindowScreen(CClient *this,int Index)

{
  int iVar1;
  
  if (this->m_pConfig->m_GfxFullscreen != 0) {
    (*(this->super_IClient).super_IInterface._vptr_IInterface[0xe])(this);
    iVar1 = (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x2f])
                      (this->m_pGraphics,Index);
    if ((char)iVar1 != '\0') {
      this->m_pConfig->m_GfxScreen = Index;
    }
    (*(this->super_IClient).super_IInterface._vptr_IInterface[0xe])(this);
    return;
  }
  iVar1 = (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x2f])
                    (this->m_pGraphics,Index);
  if ((char)iVar1 != '\0') {
    this->m_pConfig->m_GfxScreen = Index;
  }
  return;
}

Assistant:

void CClient::SwitchWindowScreen(int Index)
{
	// Todo SDL: remove this when fixed (changing screen when in fullscreen is bugged)
	if(Config()->m_GfxFullscreen)
	{
		ToggleFullscreen();
		if(Graphics()->SetWindowScreen(Index))
			Config()->m_GfxScreen = Index;
		ToggleFullscreen();
	}
	else
	{
		if(Graphics()->SetWindowScreen(Index))
			Config()->m_GfxScreen = Index;
	}
}